

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
          (pdqsort_detail *this,
          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
          begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                end,anon_class_16_2_405d1b53 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  begin_00;
  double dVar1;
  int iVar2;
  anon_class_32_4_ffb23deb *paVar3;
  HighsLpRelaxation *pHVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar10;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var11;
  pair<int,_double> *ppVar12;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var13;
  pair<int,_double> *ppVar14;
  long lVar15;
  ulong uVar16;
  pair<int,_double> *ppVar17;
  pair<int,_double> *ppVar18;
  double *pdVar19;
  anon_class_16_2_405d1b53 comp_00;
  pair<int,_double> __value;
  pair<int,_double> __value_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp_00;
  undefined1 leftmost_00;
  anon_class_32_4_ffb23deb *paVar20;
  pair<int,_double> local_98;
  uint local_84;
  anon_class_32_4_ffb23deb *local_80;
  anon_class_16_2_405d1b53 local_78;
  long local_68;
  HighsLpRelaxation *local_60;
  HighsLpRelaxation *local_58;
  pair<int,_double> *local_50;
  double *local_48;
  pair<int,_double> *local_40;
  pair<int,_double> *local_38;
  HighsLpRelaxation *pHVar9;
  
  local_60 = comp.heurlp;
  local_78.heurlp = (HighsLpRelaxation *)comp.getFixVal;
  local_50 = begin._M_current + -1;
  local_38 = begin._M_current + -2;
  local_40 = begin._M_current + -3;
  local_48 = &begin._M_current[-1].second;
  local_84 = bad_allowed;
  local_78.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
  do {
    lVar6 = (long)begin._M_current - (long)this;
    uVar8 = lVar6 >> 4;
    if ((long)uVar8 < 0x18) {
      ppVar12 = (pair<int,_double> *)((long)this + 0x10);
      if ((local_84 & 1) == 0) {
        if (ppVar12 != begin._M_current && (pair<int,_double> *)this != begin._M_current) {
          ppVar18 = (pair<int,_double> *)((long)this + -0x10);
          _Var11._M_current = (pair<int,_double> *)this;
          do {
            ppVar17 = ppVar12;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar17,
                               _Var11._M_current);
            if (bVar5) {
              local_98.first = ppVar17->first;
              local_98._4_4_ = *(undefined4 *)&ppVar17->field_0x4;
              local_98.second = ppVar17->second;
              ppVar12 = ppVar18;
              do {
                ppVar14 = ppVar12;
                ppVar14[2].first = ppVar14[1].first;
                ppVar14[2].second = ppVar14[1].second;
                bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                  ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                   ppVar14);
                ppVar12 = ppVar14 + -1;
              } while (bVar5);
              ppVar14[1].first = local_98.first;
              ppVar14[1].second = local_98.second;
            }
            ppVar18 = ppVar18 + 1;
            ppVar12 = ppVar17 + 1;
            _Var11._M_current = ppVar17;
          } while (ppVar17 + 1 != begin._M_current);
        }
        bVar5 = true;
      }
      else {
        if (ppVar12 != begin._M_current && (pair<int,_double> *)this != begin._M_current) {
          lVar6 = 0;
          _Var11._M_current = (pair<int,_double> *)this;
          do {
            ppVar18 = ppVar12;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar18,
                               _Var11._M_current);
            if (bVar5) {
              local_98.first = ppVar18->first;
              local_98._4_4_ = *(undefined4 *)&ppVar18->field_0x4;
              local_98.second = ppVar18->second;
              _Var11._M_current = ppVar18;
              lVar15 = lVar6;
              do {
                ppVar12 = _Var11._M_current;
                ppVar12->first = ppVar12[-1].first;
                ppVar12->second = ppVar12[-1].second;
                _Var11._M_current = (pair<int,_double> *)this;
                if (lVar15 == 0) break;
                _Var11._M_current = ppVar12 + -1;
                bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                  ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                   ppVar12 + -2);
                lVar15 = lVar15 + 0x10;
              } while (bVar5);
              (_Var11._M_current)->first = local_98.first;
              ppVar12[-1].second = local_98.second;
            }
            lVar6 = lVar6 + -0x10;
            ppVar12 = ppVar18 + 1;
            _Var11._M_current = ppVar18;
          } while (ppVar18 + 1 != begin._M_current);
        }
        bVar5 = true;
      }
    }
    else {
      uVar16 = uVar8 >> 1;
      ppVar12 = (pair<int,_double> *)((long)this + uVar16 * 0x10);
      local_68 = lVar6;
      if ((long)uVar8 < 0x81) {
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,
                           (pair<int,_double> *)this,ppVar12);
        if (bVar5) {
          iVar2 = ppVar12->first;
          ppVar12->first = ((pair<int,_double> *)this)->first;
          ((pair<int,_double> *)this)->first = iVar2;
          dVar1 = ppVar12->second;
          ppVar12->second = ((pair<int,_double> *)this)->second;
          ((pair<int,_double> *)this)->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,local_50,
                           (pair<int,_double> *)this);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)this)->first;
          ((pair<int,_double> *)this)->first = begin._M_current[-1].first;
          begin._M_current[-1].first = iVar2;
          dVar1 = ((pair<int,_double> *)this)->second;
          ((pair<int,_double> *)this)->second = begin._M_current[-1].second;
          begin._M_current[-1].second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,
                           (pair<int,_double> *)this,ppVar12);
        if (bVar5) {
          iVar2 = ppVar12->first;
          ppVar12->first = ((pair<int,_double> *)this)->first;
          ((pair<int,_double> *)this)->first = iVar2;
          dVar1 = ppVar12->second;
          ppVar12->second = ((pair<int,_double> *)this)->second;
          ((pair<int,_double> *)this)->second = dVar1;
        }
      }
      else {
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,
                           (pair<int,_double> *)this);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)this)->first;
          ((pair<int,_double> *)this)->first = ppVar12->first;
          ppVar12->first = iVar2;
          dVar1 = ((pair<int,_double> *)this)->second;
          ((pair<int,_double> *)this)->second = ppVar12->second;
          ppVar12->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,local_50,ppVar12);
        if (bVar5) {
          iVar2 = ppVar12->first;
          ppVar12->first = begin._M_current[-1].first;
          begin._M_current[-1].first = iVar2;
          dVar1 = ppVar12->second;
          ppVar12->second = begin._M_current[-1].second;
          begin._M_current[-1].second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,
                           (pair<int,_double> *)this);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)this)->first;
          ((pair<int,_double> *)this)->first = ppVar12->first;
          ppVar12->first = iVar2;
          dVar1 = ((pair<int,_double> *)this)->second;
          ((pair<int,_double> *)this)->second = ppVar12->second;
          ppVar12->second = dVar1;
        }
        local_80 = (anon_class_32_4_ffb23deb *)((long)this + 0x10);
        ppVar18 = (pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10);
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar18,
                           (pair<int,_double> *)local_80);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)((long)this + 0x10))->first;
          ((pair<int,_double> *)((long)this + 0x10))->first = ppVar18->first;
          ppVar18->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
          ((pair<int,_double> *)((long)this + 0x10))->second =
               ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,local_38,ppVar18);
        if (bVar5) {
          iVar2 = ppVar18->first;
          ppVar18->first = begin._M_current[-2].first;
          begin._M_current[-2].first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second =
               begin._M_current[-2].second;
          begin._M_current[-2].second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar18,
                           (pair<int,_double> *)local_80);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)((long)this + 0x10))->first;
          ((pair<int,_double> *)((long)this + 0x10))->first = ppVar18->first;
          ppVar18->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
          ((pair<int,_double> *)((long)this + 0x10))->second =
               ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second = dVar1;
        }
        local_80 = (anon_class_32_4_ffb23deb *)((long)this + 0x20);
        ppVar17 = (pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10);
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar17,
                           (pair<int,_double> *)local_80);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)((long)this + 0x20))->first;
          ((pair<int,_double> *)((long)this + 0x20))->first = ppVar17->first;
          ppVar17->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
          ((pair<int,_double> *)((long)this + 0x20))->second =
               ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,local_40,ppVar17);
        if (bVar5) {
          iVar2 = ppVar17->first;
          ppVar17->first = begin._M_current[-3].first;
          begin._M_current[-3].first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second =
               begin._M_current[-3].second;
          begin._M_current[-3].second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar17,
                           (pair<int,_double> *)local_80);
        if (bVar5) {
          iVar2 = ((pair<int,_double> *)((long)this + 0x20))->first;
          ((pair<int,_double> *)((long)this + 0x20))->first = ppVar17->first;
          ppVar17->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
          ((pair<int,_double> *)((long)this + 0x20))->second =
               ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,ppVar18);
        if (bVar5) {
          iVar2 = ppVar18->first;
          ppVar18->first = ppVar12->first;
          ppVar12->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second = ppVar12->second;
          ppVar12->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar17,ppVar12);
        if (bVar5) {
          iVar2 = ppVar12->first;
          ppVar12->first = ppVar17->first;
          ppVar17->first = iVar2;
          dVar1 = ppVar12->second;
          ppVar12->second = ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 + 1) * 0x10))->second = dVar1;
        }
        bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,ppVar18);
        if (bVar5) {
          iVar2 = ppVar18->first;
          ppVar18->first = ppVar12->first;
          ppVar12->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar16 - 1) * 0x10))->second = ppVar12->second;
          ppVar12->second = dVar1;
        }
        iVar2 = ((pair<int,_double> *)this)->first;
        ((pair<int,_double> *)this)->first = ppVar12->first;
        ppVar12->first = iVar2;
        dVar1 = ((pair<int,_double> *)this)->second;
        ((pair<int,_double> *)this)->second = ppVar12->second;
        ppVar12->second = dVar1;
      }
      if (((local_84 & 1) != 0) ||
         (bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,(pair<int,_double> *)((long)this + -0x10),
                             (pair<int,_double> *)this), bVar5)) {
        local_80 = local_78.getFixVal;
        local_58 = local_78.heurlp;
        local_98.first = ((pair<int,_double> *)this)->first;
        local_98._4_4_ = *(undefined4 *)&((pair<int,_double> *)this)->field_0x4;
        local_98.second = ((pair<int,_double> *)this)->second;
        lVar6 = 0x10;
        _Var11._M_current = (pair<int,_double> *)this;
        paVar20 = local_78.getFixVal;
        do {
          _Var11._M_current = _Var11._M_current + 1;
          bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,_Var11._M_current,
                             &local_98);
          lVar6 = lVar6 + -0x10;
        } while (bVar5);
        _Var13._M_current = begin._M_current;
        if (lVar6 == 0) {
          do {
            if (_Var13._M_current <= _Var11._M_current) break;
            _Var13._M_current = _Var13._M_current + -1;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,
                               _Var13._M_current,&local_98);
          } while (!bVar5);
        }
        else {
          do {
            _Var13._M_current = _Var13._M_current + -1;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,
                               _Var13._M_current,&local_98);
          } while (!bVar5);
        }
        leftmost_00 = SUB81(paVar20,0);
        ppVar12 = _Var13._M_current;
        ppVar18 = _Var11._M_current;
        if (_Var11._M_current < _Var13._M_current) {
          do {
            iVar2 = ppVar18->first;
            ppVar18->first = ppVar12->first;
            ppVar12->first = iVar2;
            dVar1 = ppVar18->second;
            ppVar18->second = ppVar12->second;
            ppVar12->second = dVar1;
            do {
              ppVar18 = ppVar18 + 1;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar18,
                                 &local_98);
            } while (bVar5);
            do {
              ppVar12 = ppVar12 + -1;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,
                                 &local_98);
              leftmost_00 = SUB81(paVar20,0);
            } while (!bVar5);
          } while (ppVar18 < ppVar12);
        }
        pHVar4 = local_58;
        paVar20 = local_80;
        begin_00._M_current = ppVar18 + -1;
        ((pair<int,_double> *)this)->first = ppVar18[-1].first;
        ((pair<int,_double> *)this)->second = ppVar18[-1].second;
        ppVar18[-1].first = local_98.first;
        ppVar18[-1].second = local_98.second;
        uVar10 = (long)begin_00._M_current - (long)this >> 4;
        uVar16 = (long)begin._M_current - (long)ppVar18 >> 4;
        if (((long)uVar10 < (long)(uVar8 >> 3)) || ((long)uVar16 < (long)(uVar8 >> 3))) {
          uVar7 = (int)local_60 - 1;
          pHVar9 = (HighsLpRelaxation *)(ulong)uVar7;
          if (uVar7 == 0) {
            lVar6 = (long)((uVar8 - ((long)(uVar8 - 2) >> 0x3f)) + -2) >> 1;
            do {
              __value._4_4_ = 0;
              __value.first = ((pair<int,_double> *)((long)this + lVar6 * 0x10))->first;
              __value.second = ((pair<int,_double> *)((long)this + lVar6 * 0x10))->second;
              __comp._M_comp.heurlp = pHVar4;
              __comp._M_comp.getFixVal = paVar20;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                        ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          )this,lVar6,uVar8,__value,__comp);
              pHVar9 = local_78.heurlp;
              paVar3 = local_78.getFixVal;
              bVar5 = lVar6 != 0;
              lVar6 = lVar6 + -1;
            } while (bVar5);
            lVar6 = local_68;
            pdVar19 = local_48;
            if (local_68 < 0x11) {
              local_60 = (HighsLpRelaxation *)0x0;
LAB_002e0d76:
              bVar5 = true;
            }
            else {
              do {
                __value_00._4_4_ = 0;
                __value_00.first = ((pair<int,_double> *)(pdVar19 + -1))->first;
                dVar1 = *pdVar19;
                ((pair<int,_double> *)(pdVar19 + -1))->first = ((pair<int,_double> *)this)->first;
                *pdVar19 = ((pair<int,_double> *)this)->second;
                lVar6 = lVar6 + -0x10;
                __value_00.second = dVar1;
                __comp_00._M_comp.heurlp = pHVar9;
                __comp_00._M_comp.getFixVal = paVar3;
                std::
                __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                          ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                            )this,0,lVar6 >> 4,__value_00,__comp_00);
                pdVar19 = pdVar19 + -2;
              } while (0x10 < lVar6);
              local_60 = (HighsLpRelaxation *)0x0;
              bVar5 = true;
            }
            goto LAB_002e0d79;
          }
          if (0x17 < (long)uVar10) {
            uVar8 = uVar10 >> 2;
            iVar2 = ((pair<int,_double> *)this)->first;
            ((pair<int,_double> *)this)->first =
                 ((pair<int,_double> *)((long)this + uVar8 * 0x10))->first;
            ((pair<int,_double> *)((long)this + uVar8 * 0x10))->first = iVar2;
            dVar1 = ((pair<int,_double> *)this)->second;
            ((pair<int,_double> *)this)->second =
                 ((pair<int,_double> *)((long)this + uVar8 * 0x10))->second;
            ((pair<int,_double> *)((long)this + uVar8 * 0x10))->second = dVar1;
            ppVar12 = begin_00._M_current + -uVar8;
            iVar2 = ppVar18[-2].first;
            ppVar18[-2].first = ppVar12->first;
            ppVar12->first = iVar2;
            dVar1 = ppVar18[-2].second;
            ppVar18[-2].second = ppVar12->second;
            ppVar12->second = dVar1;
            if (0x80 < (long)uVar10) {
              iVar2 = ((pair<int,_double> *)((long)this + 0x10))->first;
              ((pair<int,_double> *)((long)this + 0x10))->first =
                   ((pair<int,_double> *)((long)this + (uVar8 + 1) * 0x10))->first;
              ((pair<int,_double> *)((long)this + (uVar8 + 1) * 0x10))->first = iVar2;
              dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
              ((pair<int,_double> *)((long)this + 0x10))->second =
                   ((pair<int,_double> *)((long)this + (uVar8 + 1) * 0x10))->second;
              ((pair<int,_double> *)((long)this + (uVar8 + 1) * 0x10))->second = dVar1;
              iVar2 = ((pair<int,_double> *)((long)this + 0x20))->first;
              ((pair<int,_double> *)((long)this + 0x20))->first =
                   ((pair<int,_double> *)((long)this + (uVar8 + 2) * 0x10))->first;
              ((pair<int,_double> *)((long)this + (uVar8 + 2) * 0x10))->first = iVar2;
              dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
              ((pair<int,_double> *)((long)this + 0x20))->second =
                   ((pair<int,_double> *)((long)this + (uVar8 + 2) * 0x10))->second;
              ((pair<int,_double> *)((long)this + (uVar8 + 2) * 0x10))->second = dVar1;
              lVar6 = -uVar8;
              uVar8 = ~uVar8;
              iVar2 = ppVar18[-3].first;
              ppVar18[-3].first = begin_00._M_current[uVar8].first;
              begin_00._M_current[uVar8].first = iVar2;
              dVar1 = ppVar18[-3].second;
              ppVar18[-3].second = ppVar18[uVar8 - 1].second;
              ppVar18[uVar8 - 1].second = dVar1;
              iVar2 = ppVar18[-4].first;
              ppVar18[-4].first = begin_00._M_current[lVar6 + -2].first;
              begin_00._M_current[lVar6 + -2].first = iVar2;
              dVar1 = ppVar18[-4].second;
              ppVar18[-4].second = ppVar18[lVar6 + -3].second;
              ppVar18[lVar6 + -3].second = dVar1;
            }
          }
          local_60 = pHVar9;
          if (0x17 < (long)uVar16) {
            uVar8 = uVar16 >> 2;
            iVar2 = ppVar18->first;
            ppVar18->first = ppVar18[uVar8].first;
            ppVar18[uVar8].first = iVar2;
            dVar1 = ppVar18->second;
            ppVar18->second = ppVar18[uVar8].second;
            ppVar18[uVar8].second = dVar1;
            ppVar12 = begin._M_current + -uVar8;
            iVar2 = begin._M_current[-1].first;
            begin._M_current[-1].first = ppVar12->first;
            ppVar12->first = iVar2;
            dVar1 = begin._M_current[-1].second;
            begin._M_current[-1].second = ppVar12->second;
            ppVar12->second = dVar1;
            if (0x80 < (long)uVar16) {
              iVar2 = ppVar18[1].first;
              ppVar18[1].first = ppVar18[uVar8 + 1].first;
              ppVar18[uVar8 + 1].first = iVar2;
              dVar1 = ppVar18[1].second;
              ppVar18[1].second = ppVar18[uVar8 + 1].second;
              ppVar18[uVar8 + 1].second = dVar1;
              iVar2 = ppVar18[2].first;
              ppVar18[2].first = ppVar18[uVar8 + 2].first;
              ppVar18[uVar8 + 2].first = iVar2;
              dVar1 = ppVar18[2].second;
              ppVar18[2].second = ppVar18[uVar8 + 2].second;
              ppVar18[uVar8 + 2].second = dVar1;
              lVar6 = -2 - uVar8;
              uVar8 = ~uVar8;
              iVar2 = begin._M_current[-2].first;
              begin._M_current[-2].first = begin._M_current[uVar8].first;
              begin._M_current[uVar8].first = iVar2;
              dVar1 = begin._M_current[-2].second;
              begin._M_current[-2].second = begin._M_current[uVar8].second;
              begin._M_current[uVar8].second = dVar1;
              iVar2 = begin._M_current[-3].first;
              begin._M_current[-3].first = begin._M_current[lVar6].first;
              begin._M_current[lVar6].first = iVar2;
              dVar1 = begin._M_current[-3].second;
              begin._M_current[-3].second = begin._M_current[lVar6].second;
              begin._M_current[lVar6].second = dVar1;
            }
          }
        }
        else if (_Var13._M_current <= _Var11._M_current) {
          if ((pair<int,_double> *)this == begin_00._M_current) {
LAB_002e0c52:
            if (ppVar18 == begin._M_current) goto LAB_002e0d76;
            lVar6 = 0;
            uVar8 = 0;
            ppVar12 = ppVar18;
            paVar20 = local_80;
            do {
              ppVar17 = ppVar12 + 1;
              if (ppVar17 == begin._M_current) goto LAB_002e0d76;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar17,
                                 ppVar12);
              if (bVar5) {
                local_98.first = ppVar17->first;
                local_98._4_4_ = *(undefined4 *)&ppVar17->field_0x4;
                local_98.second = ppVar12[1].second;
                ppVar12 = ppVar17;
                local_68 = lVar6;
                do {
                  ppVar14 = ppVar12;
                  ppVar14->first = ppVar14[-1].first;
                  ppVar14->second = ppVar14[-1].second;
                  ppVar12 = ppVar18;
                  if (lVar6 == 0) break;
                  ppVar12 = ppVar14 + -1;
                  bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                    ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                     ppVar14 + -2);
                  lVar6 = lVar6 + 0x10;
                } while (bVar5);
                ppVar12->first = local_98.first;
                ppVar14[-1].second = local_98.second;
                uVar8 = uVar8 + ((long)ppVar17 - (long)ppVar12 >> 4);
                lVar6 = local_68;
              }
              leftmost_00 = SUB81(paVar20,0);
              lVar6 = lVar6 + -0x10;
              ppVar12 = ppVar17;
            } while (uVar8 < 9);
          }
          else {
            local_68 = 0;
            uVar8 = 0;
            _Var11._M_current = (pair<int,_double> *)this;
            do {
              ppVar12 = _Var11._M_current + 1;
              if (ppVar12 == begin_00._M_current) goto LAB_002e0c52;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,ppVar12,
                                 _Var11._M_current);
              if (bVar5) {
                local_98.first = ppVar12->first;
                local_98._4_4_ = *(undefined4 *)&ppVar12->field_0x4;
                local_98.second = _Var11._M_current[1].second;
                _Var11._M_current = ppVar12;
                lVar6 = local_68;
                do {
                  ppVar17 = _Var11._M_current;
                  ppVar17->first = ppVar17[-1].first;
                  ppVar17->second = ppVar17[-1].second;
                  _Var11._M_current = (pair<int,_double> *)this;
                  if (lVar6 == 0) break;
                  _Var11._M_current = ppVar17 + -1;
                  bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                    ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                     ppVar17 + -2);
                  lVar6 = lVar6 + 0x10;
                } while (bVar5);
                (_Var11._M_current)->first = local_98.first;
                ppVar17[-1].second = local_98.second;
                uVar8 = uVar8 + ((long)ppVar12 - (long)_Var11._M_current >> 4);
              }
              leftmost_00 = SUB81(paVar20,0);
              local_68 = local_68 + -0x10;
              _Var11._M_current = ppVar12;
            } while (uVar8 < 9);
          }
        }
        comp_00.heurlp = local_60;
        comp_00.getFixVal = (anon_class_32_4_ffb23deb *)local_78.heurlp;
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
                  (this,begin_00,
                   (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                    )local_78.getFixVal,comp_00,local_84 & 1,(bool)leftmost_00);
        bVar5 = false;
        local_84 = 0;
        this = (pdqsort_detail *)ppVar18;
      }
      else {
        local_98.first = ((pair<int,_double> *)this)->first;
        local_98._4_4_ = *(undefined4 *)&((pair<int,_double> *)this)->field_0x4;
        local_98.second = ((pair<int,_double> *)this)->second;
        lVar6 = -0x10;
        _Var11._M_current = begin._M_current;
        do {
          _Var11._M_current = _Var11._M_current + -1;
          bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                             _Var11._M_current);
          lVar6 = lVar6 + 0x10;
        } while (bVar5);
        _Var13._M_current = (pair<int,_double> *)this;
        if (lVar6 == 0) {
          do {
            if (_Var11._M_current <= _Var13._M_current) break;
            _Var13._M_current = _Var13._M_current + 1;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                               _Var13._M_current);
          } while (!bVar5);
        }
        else {
          do {
            _Var13._M_current = _Var13._M_current + 1;
            bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                               _Var13._M_current);
          } while (!bVar5);
        }
        if (_Var13._M_current < _Var11._M_current) {
          do {
            iVar2 = (_Var13._M_current)->first;
            (_Var13._M_current)->first = (_Var11._M_current)->first;
            (_Var11._M_current)->first = iVar2;
            dVar1 = (_Var13._M_current)->second;
            (_Var13._M_current)->second = (_Var11._M_current)->second;
            (_Var11._M_current)->second = dVar1;
            do {
              _Var11._M_current = _Var11._M_current + -1;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                 _Var11._M_current);
            } while (bVar5);
            do {
              _Var13._M_current = _Var13._M_current + 1;
              bVar5 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)&stack0xffffffffffffff38,&local_98,
                                 _Var13._M_current);
            } while (!bVar5);
          } while (_Var13._M_current < _Var11._M_current);
        }
        ((pair<int,_double> *)this)->first = (_Var11._M_current)->first;
        ((pair<int,_double> *)this)->second = (_Var11._M_current)->second;
        (_Var11._M_current)->first = local_98.first;
        (_Var11._M_current)->second = local_98.second;
        this = (pdqsort_detail *)(_Var11._M_current + 1);
        bVar5 = false;
      }
    }
LAB_002e0d79:
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }